

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall SQVM::StringCat(SQVM *this,SQObjectPtr *str,SQObjectPtr *obj,SQObjectPtr *dest)

{
  size_t __n;
  bool bVar1;
  SQChar *__dest;
  SQSharedState *pSVar2;
  long in_RDI;
  SQChar *s;
  SQInteger ol;
  SQInteger l;
  SQObjectPtr b;
  SQObjectPtr a;
  SQString *in_stack_ffffffffffffff60;
  SQInteger in_stack_ffffffffffffff68;
  SQString *x;
  SQSharedState *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  SQObjectPtr *in_stack_ffffffffffffffb0;
  SQVM *in_stack_ffffffffffffffb8;
  SQObjectValue local_40;
  SQObjectPtr local_38 [3];
  byte local_1;
  
  ::SQObjectPtr::SQObjectPtr(local_38);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffb8);
  bVar1 = ToString(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                   (SQObjectPtr *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (bVar1) {
    bVar1 = ToString(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                     (SQObjectPtr *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (bVar1) {
      pSVar2 = ((local_38[0].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
               _sharedstate;
      __n = (local_40.pString)->_len;
      __dest = SQSharedState::GetScratchPad(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      memcpy(__dest,&(local_38[0].super_SQObject._unVal.pTable)->_firstfree,(size_t)pSVar2);
      memcpy(__dest + (long)pSVar2,&(local_40.pTable)->_firstfree,__n);
      x = *(SQString **)(in_RDI + 0x118);
      pSVar2 = (SQSharedState *)SQSharedState::GetScratchPad(in_stack_ffffffffffffff70,(SQInteger)x)
      ;
      in_stack_ffffffffffffff60 =
           SQString::Create(pSVar2,(SQChar *)x,(SQInteger)in_stack_ffffffffffffff60);
      ::SQObjectPtr::operator=((SQObjectPtr *)pSVar2,x);
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
  }
  else {
    local_1 = 0;
  }
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff60);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff60);
  return (bool)(local_1 & 1);
}

Assistant:

bool SQVM::StringCat(const SQObjectPtr &str,const SQObjectPtr &obj,SQObjectPtr &dest)
{
    SQObjectPtr a, b;
    if(!ToString(str, a)) return false;
    if(!ToString(obj, b)) return false;
    SQInteger l = _string(a)->_len , ol = _string(b)->_len;
    SQChar *s = _sp(sq_rsl(l + ol + 1));
    memcpy(s, _stringval(a), sq_rsl(l));
    memcpy(s + l, _stringval(b), sq_rsl(ol));
    dest = SQString::Create(_ss(this), _spval, l + ol);
    return true;
}